

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classical_ising_polynomial.hpp
# Opt level: O2

pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double> * __thiscall
openjij::system::ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_>::FindMaxInteraction
          (pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double>
           *__return_storage_ptr__,
          ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_> *this)

{
  double dVar1;
  runtime_error *this_00;
  pointer pvVar2;
  size_t i;
  ulong uVar3;
  pointer pvVar4;
  long lVar5;
  double local_58;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  pvVar4 = (this->poly_key_list_).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->poly_key_list_).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar2 != pvVar4) {
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58 = 0.0;
    lVar5 = 0;
    for (uVar3 = 0; uVar3 < (ulong)(((long)pvVar2 - (long)pvVar4) / 0x18); uVar3 = uVar3 + 1) {
      dVar1 = (this->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar3];
      if (ABS(local_58) < ABS(dVar1)) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   ((long)&(pvVar4->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start + lVar5));
        pvVar4 = (this->poly_key_list_).
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar2 = (this->poly_key_list_).
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_58 = dVar1;
      }
      lVar5 = lVar5 + 0x18;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&__return_storage_ptr__->first,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48);
    __return_storage_ptr__->second = local_58;
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Interactions are empty.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::pair<std::vector<graph::Index>, FloatType> FindMaxInteraction() const {
    if (poly_key_list_.size() == 0) {
      throw std::runtime_error("Interactions are empty.");
    }
    FloatType max_val = 0.0;
    std::vector<graph::Index> max_key = {};
    for (std::size_t i = 0; i < poly_key_list_.size(); ++i) {
      if (std::abs(max_val) < std::abs(poly_value_list_[i])) {
        max_val = poly_value_list_[i];
        max_key = poly_key_list_[i];
      }
    }
    return std::pair<std::vector<graph::Index>, FloatType>(max_key, max_val);
  }